

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DCase::createAndUploadTexture
          (TextureGather2DCase *this)

{
  ostringstream *this_00;
  RenderContext *context;
  Texture2D *pTVar1;
  TextureFormat TVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  undefined4 extraout_var;
  Texture2D *this_01;
  long *plVar6;
  size_type *psVar7;
  long lVar8;
  void *__buf;
  ConstPixelBufferAccess *access;
  long lVar9;
  long lVar10;
  TextureFormatInfo texFmtInfo;
  string local_488;
  string local_468;
  long local_448;
  long local_440;
  long *local_438 [2];
  long local_428 [2];
  long *local_418 [2];
  long local_408 [2];
  LogImage local_3f8;
  TextureFormatInfo local_368;
  undefined8 local_328 [14];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  context = ((this->super_TextureGatherCase).super_TestCase.m_context)->m_renderCtx;
  iVar3 = (*context->_vptr_RenderContext[3])(context);
  local_448 = CONCAT44(extraout_var,iVar3);
  tcu::getTextureFormatInfo(&local_368,&(this->super_TextureGatherCase).m_textureFormat);
  this_01 = (Texture2D *)operator_new(0x70);
  dVar4 = glu::getInternalFormat((this->super_TextureGatherCase).m_textureFormat);
  glu::Texture2D::Texture2D
            (this_01,context,dVar4,(this->m_textureSize).m_data[0],(this->m_textureSize).m_data[1]);
  pTVar1 = (this->m_texture).super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.
           m_data.ptr;
  if (pTVar1 != this_01) {
    if (pTVar1 != (Texture2D *)0x0) {
      (*pTVar1->_vptr_Texture2D[1])();
      (this->m_texture).super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data
      .ptr = (Texture2D *)0x0;
    }
    (this->m_texture).super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.
    ptr = this_01;
  }
  pTVar1 = (this->m_texture).super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.
           m_data.ptr;
  iVar3 = (this->super_TextureGatherCase).m_baseLevel;
  if (((this->super_TextureGatherCase).m_minFilter - NEAREST_MIPMAP_NEAREST < 4) &&
     (((this->super_TextureGatherCase).m_flags & 1) == 0)) {
    iVar5 = (int)((ulong)((long)(pTVar1->m_refTexture).super_TextureLevelPyramid.m_access.
                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar1->m_refTexture).super_TextureLevelPyramid.m_access.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
  }
  else {
    iVar5 = iVar3 + 1;
  }
  if (iVar3 < iVar5) {
    lVar8 = (long)iVar5 - (long)iVar3;
    lVar9 = (long)iVar3 * 0x28;
    do {
      local_440 = lVar8;
      tcu::Texture2D::allocLevel(&pTVar1->m_refTexture,iVar3);
      lVar8 = (long)(pTVar1->m_refTexture).super_TextureLevelPyramid.m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      access = (ConstPixelBufferAccess *)(lVar9 + lVar8);
      dVar4 = tcu::CommandLine::getBaseSeed
                        (((this->super_TextureGatherCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx)->m_cmdLine);
      fillWithRandomColorTiles
                ((PixelBufferAccess *)access,&local_368.valueMin,&local_368.valueMax,dVar4);
      TVar2 = (TextureFormat)
              ((this->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
      std::ostream::operator<<((ostringstream *)local_328,iVar3);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
      std::ios_base::~ios_base(local_2b8);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_418,0,(char *)0x0,0x1cc2532);
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_468.field_2._M_allocated_capacity = *psVar7;
        local_468.field_2._8_8_ = plVar6[3];
      }
      else {
        local_468.field_2._M_allocated_capacity = *psVar7;
        local_468._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_468._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
      std::ostream::operator<<((ostringstream *)local_328,iVar3);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
      std::ios_base::~ios_base(local_2b8);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_438,0,(char *)0x0,0x1cc2544);
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_488.field_2._M_allocated_capacity = *psVar7;
        local_488.field_2._8_8_ = plVar6[3];
      }
      else {
        local_488.field_2._M_allocated_capacity = *psVar7;
        local_488._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_488._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      tcu::LogImage::LogImage
                (&local_3f8,&local_468,&local_488,access,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_3f8,TVar2.order,__buf,(size_t)access);
      this_00 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = TVar2;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Note: texture level\'s size is ",0x1e);
      local_328[0] = *(undefined8 *)(lVar8 + 8 + lVar9);
      tcu::operator<<((ostream *)this_00,(Vector<int,_2> *)local_328);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8.m_description._M_dataplus._M_p != &local_3f8.m_description.field_2) {
        operator_delete(local_3f8.m_description._M_dataplus._M_p,
                        local_3f8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8.m_name._M_dataplus._M_p != &local_3f8.m_name.field_2) {
        operator_delete(local_3f8.m_name._M_dataplus._M_p,
                        local_3f8.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
      }
      if (local_438[0] != local_428) {
        operator_delete(local_438[0],local_428[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      lVar8 = local_440;
      if (local_418[0] != local_408) {
        operator_delete(local_418[0],local_408[0] + 1);
      }
      iVar3 = iVar3 + 1;
      lVar9 = lVar9 + 0x28;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  tcu::Texture2D::Texture2D
            ((Texture2D *)local_1b0,(TextureFormat *)&pTVar1->m_refTexture,
             (pTVar1->m_refTexture).m_width,(pTVar1->m_refTexture).m_height);
  tcu::Texture2D::operator=(&this->m_swizzledTexture,(Texture2D *)local_1b0);
  tcu::Texture3D::~Texture3D((Texture3D *)local_1b0);
  if (0 < (int)((ulong)((long)(pTVar1->m_refTexture).super_TextureLevelPyramid.m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar1->m_refTexture).super_TextureLevelPyramid.m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333) {
    lVar9 = 8;
    lVar10 = 0;
    lVar8 = 0;
    do {
      if (*(long *)((long)(pTVar1->m_refTexture).super_TextureLevelPyramid.m_data.
                          super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar9) != 0) {
        tcu::Texture2D::allocLevel(&this->m_swizzledTexture,(int)lVar8);
        swizzlePixels((PixelBufferAccess *)
                      ((long)(((this->m_swizzledTexture).super_TextureLevelPyramid.m_access.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_ConstPixelBufferAccess).m_size.m_data + lVar10 + -8),
                      (ConstPixelBufferAccess *)
                      ((long)(pTVar1->m_refTexture).super_TextureLevelPyramid.m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar10),
                      &(this->super_TextureGatherCase).m_textureSwizzle);
      }
      lVar8 = lVar8 + 1;
      lVar10 = lVar10 + 0x28;
      lVar9 = lVar9 + 0x10;
    } while (lVar8 < (int)((ulong)((long)(pTVar1->m_refTexture).super_TextureLevelPyramid.m_access.
                                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pTVar1->m_refTexture).super_TextureLevelPyramid.m_access.
                                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x33333333);
  }
  (**(code **)(local_448 + 8))(0x84c0);
  (*((this->m_texture).super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.
    ptr)->_vptr_Texture2D[2])();
  return;
}

Assistant:

void TextureGather2DCase::createAndUploadTexture (void)
{
	const glu::RenderContext&		renderCtx	= m_context.getRenderContext();
	const glw::Functions&			gl			= renderCtx.getFunctions();
	const tcu::TextureFormatInfo	texFmtInfo	= tcu::getTextureFormatInfo(m_textureFormat);

	m_texture = MovePtr<glu::Texture2D>(new glu::Texture2D(renderCtx, glu::getInternalFormat(m_textureFormat), m_textureSize.x(), m_textureSize.y()));

	{
		tcu::Texture2D&		refTexture	= m_texture->getRefTexture();
		const int			levelBegin	= m_baseLevel;
		const int			levelEnd	= isMipmapFilter(m_minFilter) && !(m_flags & GATHERCASE_MIPMAP_INCOMPLETE) ? refTexture.getNumLevels() : m_baseLevel+1;
		DE_ASSERT(m_baseLevel < refTexture.getNumLevels());

		for (int levelNdx = levelBegin; levelNdx < levelEnd; levelNdx++)
		{
			refTexture.allocLevel(levelNdx);
			const PixelBufferAccess& level = refTexture.getLevel(levelNdx);
			fillWithRandomColorTiles(level, texFmtInfo.valueMin, texFmtInfo.valueMax, (deUint32)m_testCtx.getCommandLine().getBaseSeed());
			m_testCtx.getLog() << TestLog::Image("InputTextureLevel" + de::toString(levelNdx), "Input texture, level " + de::toString(levelNdx), level)
							   << TestLog::Message << "Note: texture level's size is " << IVec2(level.getWidth(), level.getHeight()) << TestLog::EndMessage;
		}

		swizzleTexture(m_swizzledTexture, refTexture, m_textureSwizzle);
	}

	gl.activeTexture(GL_TEXTURE0);
	m_texture->upload();
}